

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

void __thiscall deqp::sl::ShaderParser::parseValue(ShaderParser *this,ValueBlock *valueBlock)

{
  char *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  Value result;
  ValueBlock *valueBlock_local;
  ShaderParser *this_local;
  
  result.elements.
  super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)valueBlock;
  ShaderCase::Value::Value((Value *)local_60);
  if (this->m_curToken == TOKEN_UNIFORM) {
    local_60._0_4_ = STORAGE_UNIFORM;
  }
  else if (this->m_curToken == TOKEN_INPUT) {
    local_60._0_4_ = STORAGE_INPUT;
  }
  else if (this->m_curToken == TOKEN_OUTPUT) {
    local_60._0_4_ = STORAGE_OUTPUT;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"unexpected token encountered when parsing value classifier",
               &local_81);
    parseError(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  advanceToken(this);
  result.valueName.field_2._8_4_ = mapDataTypeToken(this,this->m_curToken);
  if (result.valueName.field_2._8_4_ == TYPE_INVALID) {
    std::operator+(&local_b8,"unexpected token when parsing value data type: ",&this->m_curTokenStr)
    ;
    parseError(this,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  advanceToken(this);
  if ((this->m_curToken == TOKEN_IDENTIFIER) || (this->m_curToken == TOKEN_STRING)) {
    if (this->m_curToken == TOKEN_IDENTIFIER) {
      std::__cxx11::string::operator=((string *)&result,(string *)&this->m_curTokenStr);
    }
    else {
      str = (char *)std::__cxx11::string::c_str();
      parseStringLiteral_abi_cxx11_(&local_d8,this,str);
      std::__cxx11::string::operator=((string *)&result,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
  }
  else {
    std::operator+(&local_f8,"unexpected token when parsing value name: ",&this->m_curTokenStr);
    parseError(this,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  advanceToken(this);
  advanceToken(this,TOKEN_ASSIGN);
  if (this->m_curToken == TOKEN_LEFT_BRACKET) {
    advanceToken(this,TOKEN_LEFT_BRACKET);
    result.valueName.field_2._12_4_ = 0;
    while( true ) {
      parseValueElement(this,result.valueName.field_2._8_4_,(Value *)local_60);
      result.valueName.field_2._12_4_ = result.valueName.field_2._12_4_ + 1;
      if (this->m_curToken == TOKEN_RIGHT_BRACKET) break;
      if (this->m_curToken == TOKEN_VERTICAL_BAR) {
        advanceToken(this);
      }
      else {
        std::operator+(&local_118,"unexpected token in value element array: ",&this->m_curTokenStr);
        parseError(this,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
      }
    }
    advanceToken(this,TOKEN_RIGHT_BRACKET);
  }
  else {
    parseValueElement(this,result.valueName.field_2._8_4_,(Value *)local_60);
    result.valueName.field_2._12_4_ = 1;
  }
  advanceToken(this,TOKEN_SEMI_COLON);
  std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>::push_back
            ((vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_> *)
             (result.elements.
              super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),(value_type *)local_60);
  ShaderCase::Value::~Value((Value *)local_60);
  return;
}

Assistant:

void ShaderParser::parseValue(ShaderCase::ValueBlock& valueBlock)
{
	PARSE_DBG(("      parseValue()\n"));

	// Parsed results.
	ShaderCase::Value result;

	// Parse storage.
	if (m_curToken == TOKEN_UNIFORM)
		result.storageType = ShaderCase::Value::STORAGE_UNIFORM;
	else if (m_curToken == TOKEN_INPUT)
		result.storageType = ShaderCase::Value::STORAGE_INPUT;
	else if (m_curToken == TOKEN_OUTPUT)
		result.storageType = ShaderCase::Value::STORAGE_OUTPUT;
	else
		parseError(string("unexpected token encountered when parsing value classifier"));
	advanceToken();

	// Parse data type.
	result.dataType = mapDataTypeToken(m_curToken);
	if (result.dataType == TYPE_INVALID)
		parseError(string("unexpected token when parsing value data type: " + m_curTokenStr));
	advanceToken();

	// Parse value name.
	if (m_curToken == TOKEN_IDENTIFIER || m_curToken == TOKEN_STRING)
	{
		if (m_curToken == TOKEN_IDENTIFIER)
			result.valueName = m_curTokenStr;
		else
			result.valueName = parseStringLiteral(m_curTokenStr.c_str());
	}
	else
		parseError(string("unexpected token when parsing value name: " + m_curTokenStr));
	advanceToken();

	// Parse assignment operator.
	advanceToken(TOKEN_ASSIGN);

	// Parse actual value.
	if (m_curToken == TOKEN_LEFT_BRACKET) // value list
	{
		advanceToken(TOKEN_LEFT_BRACKET);
		result.arrayLength = 0;

		for (;;)
		{
			parseValueElement(result.dataType, result);
			result.arrayLength++;

			if (m_curToken == TOKEN_RIGHT_BRACKET)
				break;
			else if (m_curToken == TOKEN_VERTICAL_BAR)
			{
				advanceToken();
				continue;
			}
			else
				parseError(string("unexpected token in value element array: " + m_curTokenStr));
		}

		advanceToken(TOKEN_RIGHT_BRACKET);
	}
	else // arrays, single elements
	{
		parseValueElement(result.dataType, result);
		result.arrayLength = 1;
	}

	advanceToken(TOKEN_SEMI_COLON); // end of declaration

	valueBlock.values.push_back(result);
}